

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::FieldDescriptorProto::MergePartialFromCodedStream
          (FieldDescriptorProto *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  InternalMetadataWithArena *this_03;
  ArenaStringPtr *this_04;
  ArenaStringPtr *this_05;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  int byte_limit;
  FieldOptions *this_06;
  pair<int,_int> pVar7;
  int64 iVar8;
  UnknownFieldSet *pUVar9;
  string *psVar10;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  
  this_00 = &this->json_name_;
  this_01 = &this->default_value_;
  this_02 = &this->type_name_;
  this_03 = &this->_internal_metadata_;
  this_04 = &this->extendee_;
  this_05 = &this->name_;
LAB_002faf1e:
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_002faf42;
      input->buffer_ = pbVar2 + 1;
      uVar13 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_002faf42:
      uVar6 = io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar13 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar13 = 0x100000000;
      }
      uVar13 = uVar6 | uVar13;
    }
    uVar12 = (uint)uVar13;
    if ((uVar13 & 0x100000000) == 0) goto switchD_002fafc6_default;
    cVar11 = (char)uVar13;
    switch((uint)(uVar13 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar11 == '\n') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        psVar10 = (this->name_).ptr_;
        if (psVar10 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_05,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          psVar10 = this_05->ptr_;
        }
        bVar5 = internal::WireFormatLite::ReadBytes(input,psVar10);
        if (!bVar5) {
          return false;
        }
        internal::WireFormatLite::VerifyUtf8String
                  ((this_05->ptr_->_M_dataplus)._M_p,(int)this_05->ptr_->_M_string_length,PARSE,
                   "google.protobuf.FieldDescriptorProto.name");
        goto LAB_002faf1e;
      }
      break;
    case 2:
      if (cVar11 == '\x12') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        psVar10 = (this->extendee_).ptr_;
        if (psVar10 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_04,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          psVar10 = this_04->ptr_;
        }
        bVar5 = internal::WireFormatLite::ReadBytes(input,psVar10);
        if (!bVar5) {
          return false;
        }
        internal::WireFormatLite::VerifyUtf8String
                  ((this_04->ptr_->_M_dataplus)._M_p,(int)this_04->ptr_->_M_string_length,PARSE,
                   "google.protobuf.FieldDescriptorProto.extendee");
        goto LAB_002faf1e;
      }
      break;
    case 3:
      if (cVar11 == '\x18') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar13 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002fb398;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar6 = 0;
LAB_002fb398:
          uVar13 = io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          if ((long)uVar13 < 0) {
            return false;
          }
        }
        this->number_ = (int32)uVar13;
        goto LAB_002faf1e;
      }
      break;
    case 4:
      if (cVar11 == ' ') {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar6 = (uint32)bVar1;
          uVar12 = (uint)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002fb3b7;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar6 = 0;
LAB_002fb3b7:
          iVar8 = io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          uVar12 = (uint)iVar8;
          if (iVar8 < 0) {
            return false;
          }
        }
        if (uVar12 - 1 < 3) {
          pbVar2 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
          *pbVar2 = *pbVar2 | 1;
          this->label_ = uVar12;
        }
        else {
          pvVar3 = (this_03->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar3 & 1) == 0) {
            pUVar9 = internal::
                     InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     ::mutable_unknown_fields_slow
                               (&this_03->
                                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                               );
          }
          else {
            pUVar9 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
          }
          UnknownFieldSet::AddVarint(pUVar9,4,(long)(int)uVar12);
        }
        goto LAB_002faf1e;
      }
      break;
    case 5:
      if (cVar11 == '(') {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar6 = (uint32)bVar1;
          uVar12 = (uint)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002fb340;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar6 = 0;
LAB_002fb340:
          iVar8 = io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          uVar12 = (uint)iVar8;
          if (iVar8 < 0) {
            return false;
          }
        }
        if (uVar12 - 1 < 0x12) {
          pbVar2 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
          *pbVar2 = *pbVar2 | 2;
          this->type_ = uVar12;
        }
        else {
          pvVar3 = (this_03->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar3 & 1) == 0) {
            pUVar9 = internal::
                     InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     ::mutable_unknown_fields_slow
                               (&this_03->
                                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                               );
          }
          else {
            pUVar9 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
          }
          UnknownFieldSet::AddVarint(pUVar9,5,(long)(int)uVar12);
        }
        goto LAB_002faf1e;
      }
      break;
    case 6:
      if (cVar11 == '2') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        psVar10 = (this->type_name_).ptr_;
        if (psVar10 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_02,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          psVar10 = this_02->ptr_;
        }
        bVar5 = internal::WireFormatLite::ReadBytes(input,psVar10);
        if (!bVar5) {
          return false;
        }
        internal::WireFormatLite::VerifyUtf8String
                  ((this_02->ptr_->_M_dataplus)._M_p,(int)this_02->ptr_->_M_string_length,PARSE,
                   "google.protobuf.FieldDescriptorProto.type_name");
        goto LAB_002faf1e;
      }
      break;
    case 7:
      if (cVar11 == ':') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        psVar10 = (this->default_value_).ptr_;
        if (psVar10 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_01,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          psVar10 = this_01->ptr_;
        }
        bVar5 = internal::WireFormatLite::ReadBytes(input,psVar10);
        if (!bVar5) {
          return false;
        }
        internal::WireFormatLite::VerifyUtf8String
                  ((this_01->ptr_->_M_dataplus)._M_p,(int)this_01->ptr_->_M_string_length,PARSE,
                   "google.protobuf.FieldDescriptorProto.default_value");
        goto LAB_002faf1e;
      }
      break;
    case 8:
      if (cVar11 != 'B') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
      this_06 = this->options_;
      if (this_06 == (FieldOptions *)0x0) {
        this_06 = (FieldOptions *)operator_new(0x78);
        FieldOptions::FieldOptions(this_06);
        this->options_ = this_06;
      }
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (byte_limit = (int)(char)*puVar4, -1 < byte_limit)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (byte_limit < 0) {
          return false;
        }
      }
      pVar7 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit);
      if ((long)pVar7 < 0) {
        return false;
      }
      bVar5 = FieldOptions::MergePartialFromCodedStream(this_06,input);
      if (!bVar5) {
        return false;
      }
      bVar5 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar7.first);
      goto joined_r0x002fb320;
    case 9:
      if (cVar11 == 'H') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar13 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002fb407;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar6 = 0;
LAB_002fb407:
          uVar13 = io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          if ((long)uVar13 < 0) {
            return false;
          }
        }
        this->oneof_index_ = (int32)uVar13;
        goto LAB_002faf1e;
      }
      break;
    case 10:
      if (cVar11 == 'R') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
        psVar10 = (this->json_name_).ptr_;
        if (psVar10 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          psVar10 = this_00->ptr_;
        }
        bVar5 = internal::WireFormatLite::ReadBytes(input,psVar10);
        if (!bVar5) {
          return false;
        }
        internal::WireFormatLite::VerifyUtf8String
                  ((this_00->ptr_->_M_dataplus)._M_p,(int)this_00->ptr_->_M_string_length,PARSE,
                   "google.protobuf.FieldDescriptorProto.json_name");
        goto LAB_002faf1e;
      }
    }
switchD_002fafc6_default:
    if (uVar12 == 0) {
      return true;
    }
    if ((uVar12 & 7) == 4) {
      return true;
    }
    pvVar3 = (this_03->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar3 & 1) == 0) {
      pUVar9 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_03->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar9 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
    }
    bVar5 = internal::WireFormat::SkipField(input,uVar12,pUVar9);
joined_r0x002fb320:
    if (!bVar5) {
      return false;
    }
  } while( true );
}

Assistant:

bool FieldDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.FieldDescriptorProto)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FieldDescriptorProto.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string extendee = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_extendee()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->extendee().data(), this->extendee().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FieldDescriptorProto.extendee");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 number = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_number();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &number_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldDescriptorProto_Label_IsValid(value)) {
            set_label(static_cast< ::google::protobuf::FieldDescriptorProto_Label >(value));
          } else {
            mutable_unknown_fields()->AddVarint(4, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldDescriptorProto_Type_IsValid(value)) {
            set_type(static_cast< ::google::protobuf::FieldDescriptorProto_Type >(value));
          } else {
            mutable_unknown_fields()->AddVarint(5, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string type_name = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_type_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->type_name().data(), this->type_name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FieldDescriptorProto.type_name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string default_value = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_default_value()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->default_value().data(), this->default_value().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FieldDescriptorProto.default_value");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FieldOptions options = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 oneof_index = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(72u)) {
          set_has_oneof_index();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &oneof_index_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string json_name = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_json_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->json_name().data(), this->json_name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FieldDescriptorProto.json_name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.FieldDescriptorProto)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.FieldDescriptorProto)
  return false;
#undef DO_
}